

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

Builder * arangodb::velocypack::Collection::appendArray(Builder *builder,Slice slice)

{
  bool bVar1;
  Slice this;
  ArrayIterator *in_RSI;
  Builder *in_RDI;
  ArrayIterator it;
  Builder *sub;
  Slice in_stack_ffffffffffffffd0;
  
  ArrayIterator::ArrayIterator(in_RSI,in_stack_ffffffffffffffd0);
  while( true ) {
    bVar1 = ArrayIterator::valid((ArrayIterator *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    sub = in_RDI;
    this = ArrayIterator::value(in_RSI);
    Builder::add((Builder *)this._start,(Slice *)sub);
    ArrayIterator::next((ArrayIterator *)in_stack_ffffffffffffffd0._start);
  }
  return in_RDI;
}

Assistant:

Builder& Collection::appendArray(Builder& builder, Slice slice) {
  ArrayIterator it(slice);

  while (it.valid()) {
    builder.add(it.value());
    it.next();
  }

  return builder;
}